

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_ransac.cpp
# Opt level: O0

int runRansac(vector<Point2D,_std::allocator<Point2D>_> *dataSets,int n,int maxIterations,
             double sigma,int d,LineModel *best_model,
             set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
             *inlier_sets,double *best_error)

{
  pointer *this;
  double dVar1;
  double dVar2;
  int iVar3;
  size_type sVar4;
  result_type_conflict __s;
  reference pvVar5;
  value_type vVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  size_type sVar10;
  size_type sVar11;
  double current_distance_error_1;
  value_type local_1f0;
  int local_1e4;
  undefined8 uStack_1e0;
  int i_1;
  double distance_error;
  double current_distance_error;
  double th;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> consensus_set;
  ulong uStack_190;
  int idx_1;
  size_t j_1;
  undefined1 local_180 [4];
  int it_1;
  vector<Point2D,_std::allocator<Point2D>_> pts;
  int idx;
  int randi;
  size_t j;
  int it;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_148;
  undefined1 local_130 [8];
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  minSets;
  int local_10c;
  undefined1 local_108 [4];
  int i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> availableIndices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allIndices;
  uniform_int_distribution<int> dist;
  default_random_engine rng;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> maxInliers_set;
  undefined1 auStack_88 [8];
  LineModel currentModel;
  set<int,_std::less<int>,_std::allocator<int>_> maybe_inliers;
  int N;
  int isFound;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *inlier_sets_local;
  LineModel *best_model_local;
  int d_local;
  double sigma_local;
  int maxIterations_local;
  int n_local;
  vector<Point2D,_std::allocator<Point2D>_> *dataSets_local;
  
  maybe_inliers._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  sVar4 = std::vector<Point2D,_std::allocator<Point2D>_>::size(dataSets);
  iVar3 = (int)sVar4;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&currentModel.C_);
  LineModel::LineModel((LineModel *)auStack_88);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)&rng);
  *best_error = 1.79769313486232e+308;
  __s = time((time_t *)0x0);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&dist,__s);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)
             &allIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0,iVar3 + -1);
  this = &availableIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,(long)iVar3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108);
  for (local_10c = 0; local_10c < iVar3; local_10c = local_10c + 1) {
    minSets.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(long)local_10c;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &availableIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (value_type *)
               &minSets.
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  _it = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&j + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_148,(long)n,(value_type *)&it,(allocator<unsigned_long> *)((long)&j + 7));
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::allocator
            ((allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             ((long)&j + 6));
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)local_130,(long)maxIterations,&local_148,
           (allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)((long)&j + 6))
  ;
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~allocator
            ((allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             ((long)&j + 6));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_148);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&j + 7));
  for (j._0_4_ = 0; (int)j < maxIterations; j._0_4_ = (int)j + 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &availableIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    for (_idx = 0; _idx < (ulong)(long)n; _idx = _idx + 1) {
      pts.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           std::uniform_int_distribution<int>::operator()
                     ((uniform_int_distribution<int> *)
                      &allIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                      (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&dist
                     );
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108,
                          (long)pts.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_);
      pts.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = (int)*pvVar5;
      vVar6 = (value_type)
              (int)pts.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      pvVar7 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             *)local_130,(long)(int)j);
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar7,_idx);
      *pvVar5 = vVar6;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108);
      vVar6 = *pvVar5;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108,
                          (long)pts.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_);
      *pvVar5 = vVar6;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108);
    }
  }
  std::vector<Point2D,_std::allocator<Point2D>_>::vector
            ((vector<Point2D,_std::allocator<Point2D>_> *)local_180);
  std::vector<Point2D,_std::allocator<Point2D>_>::reserve
            ((vector<Point2D,_std::allocator<Point2D>_> *)local_180,(long)n);
  for (j_1._4_4_ = 0; j_1._4_4_ < maxIterations; j_1._4_4_ = j_1._4_4_ + 1) {
    for (uStack_190 = 0; uStack_190 < (ulong)(long)n; uStack_190 = uStack_190 + 1) {
      pvVar7 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             *)local_130,(long)j_1._4_4_);
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (pvVar7,uStack_190);
      consensus_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = (int)*pvVar5;
      pvVar8 = std::vector<Point2D,_std::allocator<Point2D>_>::operator[]
                         (dataSets,(long)consensus_set._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count._4_4_);
      pvVar9 = std::vector<Point2D,_std::allocator<Point2D>_>::operator[]
                         ((vector<Point2D,_std::allocator<Point2D>_> *)local_180,uStack_190);
      pvVar9->x = pvVar8->x;
      pvVar9->y = pvVar8->y;
    }
    pvVar8 = std::vector<Point2D,_std::allocator<Point2D>_>::operator[]
                       ((vector<Point2D,_std::allocator<Point2D>_> *)local_180,0);
    pvVar9 = std::vector<Point2D,_std::allocator<Point2D>_>::operator[]
                       ((vector<Point2D,_std::allocator<Point2D>_> *)local_180,1);
    LineModel::FindLineModel((LineModel *)auStack_88,pvVar8,pvVar9);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)&th);
    current_distance_error = sqrt(sigma * 3.841 * sigma);
    distance_error = 0.0;
    uStack_1e0 = 0;
    for (local_1e4 = 0; local_1e4 < iVar3; local_1e4 = local_1e4 + 1) {
      pvVar8 = std::vector<Point2D,_std::allocator<Point2D>_>::operator[](dataSets,(long)local_1e4);
      distance_error = LineModel::computeDistance((LineModel *)auStack_88,pvVar8);
      if (distance_error < current_distance_error) {
        local_1f0 = (value_type)local_1e4;
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
                  ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   &th,&local_1f0);
      }
    }
    sVar10 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::size
                       ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&th);
    sVar11 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::size
                       ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&rng);
    if (sVar11 < sVar10) {
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::operator=
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &rng,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&th);
    }
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)&th);
  }
  sVar10 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::size
                     ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&rng);
  if ((ulong)(long)d < sVar10) {
    dVar2 = LineModel::estimateModel
                      (best_model,dataSets,
                       (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)&rng);
    dVar1 = *best_error;
    if (dVar1 < dVar2) {
      best_model->C_ = currentModel.B_;
      best_model->A_ = (double)auStack_88;
      best_model->B_ = currentModel.A_;
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::operator=
                (inlier_sets,
                 (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &rng);
      *best_error = dVar2;
    }
    maybe_inliers._M_t._M_impl.super__Rb_tree_header._M_node_count._5_3_ = 0;
    maybe_inliers._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ = dVar1 < dVar2;
  }
  std::vector<Point2D,_std::allocator<Point2D>_>::~vector
            ((vector<Point2D,_std::allocator<Point2D>_> *)local_180);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)local_130);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &availableIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)&rng);
  LineModel::~LineModel((LineModel *)auStack_88);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&currentModel.C_);
  return maybe_inliers._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
}

Assistant:

int runRansac(vector<Point2D>& dataSets, int n, int maxIterations, double sigma,int d,
		LineModel& best_model, set<size_t>& inlier_sets, double& best_error) {


		int isFound = 0;           //算法成功的标志
		int N = dataSets.size();
		set<int> maybe_inliers;    //初始随机选取的点（的索引值）
		LineModel currentModel;
		set<size_t> maxInliers_set;  //最大内点集
		best_error = 1.7976931348623158e+308;
		default_random_engine rng(time(NULL));     //随机数生成器
		uniform_int_distribution<int> dist(0, N - 1);  //采用均匀分布



	     //1. 新建一个容器allIndices，生成0到N-1的数作为点的索引
		vector<size_t> allIndices;
		allIndices.reserve(N);
		vector<size_t> availableIndices;

		for (int i = 0; i < N; i++)
		{
			allIndices.push_back(i);
		}


	     //2.这个点集是用来计算线性模型的所需的最小点集
		vector< vector<size_t> > minSets = vector< vector<size_t> >(maxIterations, vector<size_t>(n, 0));
		//随机选点，注意避免重复选取同一个点
		for (int it = 0; it < maxIterations; it++)
		{
			availableIndices = allIndices;
			for (size_t j = 0; j < n; j++)
			{
				// 产生0到N-1的随机数
				int randi = dist(rng);
				// idx表示哪一个索引对应的点被选中
				int idx = availableIndices[randi];

				minSets[it][j] = idx;
				//cout << "idx:" << idx << endl;
				// randi对应的索引已经被选过了，从容器中删除
				// randi对应的索引用最后一个元素替换，并删掉最后一个元素
				availableIndices[randi] = availableIndices.back();
				availableIndices.pop_back();
			}
		}


		//3.主循环程序，求解最大的一致点集
		vector<Point2D> pts;
		pts.reserve(n);
		for (int it = 0; it < maxIterations; it++)
		{

			for (size_t j = 0; j < n; j++)
			{
				int idx = minSets[it][j];

				pts[j] = dataSets[idx];

			}

			//cout << pts[0].x << endl << pts[1].x << endl;
			//根据随机到的两个点计算直线的模型
			currentModel.FindLineModel(pts[0],pts[1]);  

			//currentModel.printLineParam();
			set<size_t> consensus_set;        //选取模型后，根据误差阈值t选取的内点(的索引值)

			//根据初始模型和阈值t选择内点  
			// 基于卡方检验计算出的阈值
			const double th =sqrt(3.841*sigma*sigma);
			double current_distance_error = 0.0 ;
			double distance_error = 0.0;
			for (int i = 0; i < N; i++) 
			{
				current_distance_error= currentModel.computeDistance(dataSets[i]);
				if (current_distance_error < th) {
					consensus_set.insert(i);
				}

			}

			if (consensus_set.size() > maxInliers_set.size()) {
				maxInliers_set = consensus_set;
			}
		}

		//4.根据全部的内点重新计算模型
	        //重新在内点集上找一个误差最小的模型
		if (maxInliers_set.size() > d) {
			double current_distance_error = best_model.estimateModel(dataSets, maxInliers_set);
			//若当前模型更好，则更新输出量
			if (best_error < current_distance_error) {
				best_model = currentModel;
				inlier_sets = maxInliers_set;
				best_error = current_distance_error;
				isFound = 1;
			}
		}
		return isFound;
	}